

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::load_block_8_8_grey(jpeg_encoder *this,int x)

{
  byte *pbVar1;
  int local_2c;
  sample_array_t *psStack_28;
  int i;
  sample_array_t *pDst;
  uint8 *pSrc;
  int x_local;
  jpeg_encoder *this_local;
  
  psStack_28 = this->m_sample_array;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    pbVar1 = this->m_mcu_lines[local_2c] + (x << 3);
    *psStack_28 = *pbVar1 - 0x80;
    psStack_28[1] = pbVar1[1] - 0x80;
    psStack_28[2] = pbVar1[2] - 0x80;
    psStack_28[3] = pbVar1[3] - 0x80;
    psStack_28[4] = pbVar1[4] - 0x80;
    psStack_28[5] = pbVar1[5] - 0x80;
    psStack_28[6] = pbVar1[6] - 0x80;
    psStack_28[7] = pbVar1[7] - 0x80;
    psStack_28 = psStack_28 + 8;
  }
  return;
}

Assistant:

void jpeg_encoder::load_block_8_8_grey(int x)
{
  uint8 *pSrc;
  sample_array_t *pDst = m_sample_array;
  x <<= 3;
  for (int i = 0; i < 8; i++, pDst += 8)
  {
    pSrc = m_mcu_lines[i] + x;
    pDst[0] = pSrc[0] - 128; pDst[1] = pSrc[1] - 128; pDst[2] = pSrc[2] - 128; pDst[3] = pSrc[3] - 128;
    pDst[4] = pSrc[4] - 128; pDst[5] = pSrc[5] - 128; pDst[6] = pSrc[6] - 128; pDst[7] = pSrc[7] - 128;
  }
}